

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O0

bool __thiscall QScrollArea::eventFilter(QScrollArea *this,QObject *o,QEvent *e)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  QEvent *in_RDX;
  QObject **in_RDI;
  long in_FS_OFFSET;
  QEvent *unaff_retaddr;
  QObject *in_stack_00000008;
  QScrollAreaPrivate *d;
  QScrollAreaPrivate *in_stack_00000060;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QScrollArea *)0x679784);
  bVar2 = ::operator==(in_RDI,(QPointer<QWidget> *)
                              CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if ((bVar2) && (TVar3 = QEvent::type(in_RDX), TVar3 == Resize)) {
    QScrollAreaPrivate::updateScrollBars(in_stack_00000060);
  }
  bVar2 = QAbstractScrollArea::eventFilter((QAbstractScrollArea *)d,in_stack_00000008,unaff_retaddr)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QScrollArea::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QScrollArea);
#ifdef QT_KEYPAD_NAVIGATION
    if (d->widget && o != d->widget && e->type() == QEvent::FocusIn
            && QApplicationPrivate::keypadNavigationEnabled()) {
        if (o->isWidgetType())
            ensureWidgetVisible(static_cast<QWidget *>(o));
    }
#endif
    if (o == d->widget && e->type() == QEvent::Resize)
        d->updateScrollBars();

    return QAbstractScrollArea::eventFilter(o, e);
}